

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalStreamingWindow::ExecuteFunctions
          (PhysicalStreamingWindow *this,ExecutionContext *context,DataChunk *output,
          DataChunk *delayed,GlobalOperatorState *gstate_p,OperatorState *state_p)

{
  size_type __n;
  ExpressionType EVar1;
  unsigned_long val;
  _func_int **pp_Var2;
  data_ptr_t pdVar3;
  const_reference pvVar4;
  const_reference this_00;
  type pEVar5;
  reference pvVar6;
  reference this_01;
  type other;
  reference this_02;
  pointer this_03;
  long lVar7;
  reference this_04;
  pointer this_05;
  NotImplementedException *this_06;
  uint uVar8;
  ExpressionType type;
  ExecutionContext *context_00;
  idx_t i;
  unsigned_long val_00;
  ExecutionContext *__n_00;
  allocator local_b9;
  DataChunk *local_b8;
  GlobalOperatorState *local_b0;
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
  *local_a8;
  vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
  *local_a0;
  ExecutionContext *local_98;
  DataChunk *local_90;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *local_88;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_80;
  long local_78;
  string local_70;
  string local_50;
  
  val = output->count;
  __n_00 = (ExecutionContext *)0x0;
  local_b8 = output;
  local_b0 = gstate_p;
  local_98 = context;
  local_90 = delayed;
  pvVar4 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     (&(this->super_PhysicalOperator).children,0);
  local_78 = ((long)(pvVar4->_M_data->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar4->_M_data->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_80 = &this->select_list;
  local_a0 = (vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
              *)(state_p + 9);
  local_88 = (vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              *)(state_p + 2);
  local_a8 = (vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
              *)(state_p + 5);
  do {
    if ((ExecutionContext *)
        ((long)(this->select_list).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->select_list).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n_00) {
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
      LOCK();
      local_b0[1]._vptr_GlobalOperatorState =
           (_func_int **)((long)local_b0[1]._vptr_GlobalOperatorState + lVar7);
      UNLOCK();
      return;
    }
    __n = (long)&__n_00->client + local_78;
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(local_80,(size_type)__n_00);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(this_00);
    pvVar6 = vector<duckdb::Vector,_true>::get<true>(&local_b8->data,__n);
    EVar1 = (pEVar5->super_BaseExpression).type;
    uVar8 = EVar1 - 0x78;
    if (uVar8 < 0xe) {
      if ((0x40bU >> (uVar8 & 0x1f) & 1) == 0) {
        if ((0x3000U >> (uVar8 & 0x1f) & 1) == 0) {
          if (uVar8 != 5) goto LAB_0096d16b;
          pp_Var2 = local_b0[1]._vptr_GlobalOperatorState;
          pvVar6 = vector<duckdb::Vector,_true>::get<true>(&local_b8->data,__n);
          pdVar3 = pvVar6->data;
          for (val_00 = 0; val != val_00; val_00 = val_00 + 1) {
            lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val_00);
            *(long *)(pdVar3 + val_00 * 8) = lVar7 + (long)pp_Var2;
          }
        }
        else {
          this_02 = vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                    ::get<true>(local_a0,(size_type)__n_00);
          this_03 = unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
                    ::operator->(this_02);
          StreamingWindowState::LeadLagState::Execute(this_03,local_98,local_b8,local_90,pvVar6);
        }
      }
      else {
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&local_b8->data,__n);
        this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(local_88,(size_type)__n_00);
        other = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_01);
        Vector::Reference(pvVar6,other);
      }
    }
    else {
LAB_0096d16b:
      if (EVar1 != WINDOW_AGGREGATE) {
        this_06 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&local_50,"%s for StreamingWindow",&local_b9);
        ExpressionTypeToString_abi_cxx11_
                  (&local_70,(duckdb *)(ulong)(pEVar5->super_BaseExpression).type,type);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_06,&local_50,&local_70);
        __cxa_throw(this_06,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      context_00 = __n_00;
      this_04 = vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
                ::get<true>(local_a8,(size_type)__n_00);
      this_05 = unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>
                ::operator->(this_04);
      StreamingWindowState::AggregateState::Execute(this_05,context_00,local_b8,pvVar6);
    }
    __n_00 = (ExecutionContext *)((long)&__n_00->client + 1);
  } while( true );
}

Assistant:

void PhysicalStreamingWindow::ExecuteFunctions(ExecutionContext &context, DataChunk &output, DataChunk &delayed,
                                               GlobalOperatorState &gstate_p, OperatorState &state_p) const {
	auto &gstate = gstate_p.Cast<StreamingWindowGlobalState>();
	auto &state = state_p.Cast<StreamingWindowState>();

	// Compute window functions
	const idx_t count = output.size();
	const column_t input_width = children[0].get().GetTypes().size();
	for (column_t expr_idx = 0; expr_idx < select_list.size(); expr_idx++) {
		column_t col_idx = input_width + expr_idx;
		auto &expr = *select_list[expr_idx];
		auto &result = output.data[col_idx];
		switch (expr.GetExpressionType()) {
		case ExpressionType::WINDOW_AGGREGATE:
			state.aggregate_states[expr_idx]->Execute(context, output, result);
			break;
		case ExpressionType::WINDOW_FIRST_VALUE:
		case ExpressionType::WINDOW_PERCENT_RANK:
		case ExpressionType::WINDOW_RANK:
		case ExpressionType::WINDOW_RANK_DENSE: {
			// Reference constant vector
			output.data[col_idx].Reference(*state.const_vectors[expr_idx]);
			break;
		}
		case ExpressionType::WINDOW_ROW_NUMBER: {
			// Set row numbers
			int64_t start_row = gstate.row_number;
			auto rdata = FlatVector::GetData<int64_t>(output.data[col_idx]);
			for (idx_t i = 0; i < count; i++) {
				rdata[i] = NumericCast<int64_t>(start_row + NumericCast<int64_t>(i));
			}
			break;
		}
		case ExpressionType::WINDOW_LAG:
		case ExpressionType::WINDOW_LEAD:
			state.lead_lag_states[expr_idx]->Execute(context, output, delayed, result);
			break;
		default:
			throw NotImplementedException("%s for StreamingWindow", ExpressionTypeToString(expr.GetExpressionType()));
		}
	}
	gstate.row_number += NumericCast<int64_t>(count);
}